

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O0

void calc<double>(options2 *opt)

{
  fvar<double,_2UL> f_00;
  fvar<double,_2UL> fVar1;
  fvar<double,_2UL> f_01;
  fvar<double,_2UL> f_02;
  fvar<double,_2UL> beta_00;
  fvar<double,_2UL> beta_01;
  fvar<double,_2UL> beta_02;
  bool bVar2;
  _Setprecision _Var3;
  invalid_argument *piVar4;
  ostream *poVar5;
  ostream *poVar6;
  void *pvVar7;
  ostream *poVar8;
  ostream *poVar9;
  double dVar10;
  double dVar11;
  double Jx_00;
  root_type rVar12;
  fvar<double,_2UL> f;
  autodiff_fvar<double,_2UL> beta;
  real_t_conflict t;
  real_t_conflict dT;
  real_t_conflict Tmax;
  real_t_conflict Tmin;
  real_t_conflict Jy;
  real_t_conflict Jx;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  double in_stack_fffffffffffffe98;
  double in_stack_fffffffffffffea8;
  ostream *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec0;
  double in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined8 local_70;
  double local_60;
  undefined8 local_58;
  undefined8 local_50;
  double local_48;
  double in_stack_ffffffffffffffc8;
  double local_28;
  double dVar13;
  
  dVar10 = convert<double>((string *)0x1209f0);
  dVar11 = convert<double>((string *)0x120a0a);
  bVar2 = std::operator==(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  if (!bVar2) {
    bVar2 = std::operator==(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    if (!bVar2) {
      local_48 = convert<double>((string *)0x120a92);
      local_28 = convert<double>((string *)0x120aac);
      Jx_00 = convert<double>((string *)0x120ac9);
      goto LAB_00120ad2;
    }
  }
  Jx_00 = ising::tc::square<double>((double)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_28 = Jx_00;
  local_48 = Jx_00;
LAB_00120ad2:
  if ((local_48 < 0.0) || (local_28 < 0.0)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Temperature should be positive");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (local_28 < local_48) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Tmax should be larger than Tmin");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (Jx_00 <= 0.0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"dT should be positive");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::scientific);
  _Var3 = std::setprecision(0xf);
  poVar6 = std::operator<<(poVar5,_Var3);
  poVar6 = std::operator<<(poVar6,"# lattice: square\n");
  poVar6 = std::operator<<(poVar6,"# precision: ");
  pvVar7 = (void *)std::ostream::operator<<(poVar6,0xf);
  poVar6 = (ostream *)std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar6,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n");
  dVar13 = local_48;
  for (; local_48 < Jx_00 * 0.0001 + local_28; local_48 = Jx_00 + local_48) {
    boost::math::differentiation::autodiff_v1::make_fvar<double,_2UL>
              ((double *)in_stack_fffffffffffffe70);
    beta_02.v._M_elems[1] = dVar11;
    beta_02.v._M_elems[0] = dVar13;
    beta_02.v._M_elems[2] = dVar10;
    ising::free_energy::square::
    infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
              (Jx_00,in_stack_ffffffffffffffc8,beta_02);
    poVar6 = std::operator<<((ostream *)&std::cout,"inf inf ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar10);
    poVar6 = std::operator<<(poVar6,' ');
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar11);
    poVar6 = std::operator<<(poVar6,' ');
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_48);
    poVar6 = std::operator<<(poVar6,' ');
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1.0 / local_48);
    poVar6 = std::operator<<(poVar6,' ');
    f_00.v._M_elems[1] = (double)local_70;
    f_00.v._M_elems[0] = (double)local_78;
    f_00.v._M_elems[2] = local_60;
    fVar1.v._M_elems[1] = (double)local_50;
    fVar1.v._M_elems[0] = (double)local_58;
    fVar1.v._M_elems[2] = in_stack_fffffffffffffe98;
    rVar12 = ising::free_energy::
             free_energy<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                       (f_00,fVar1);
    poVar8 = (ostream *)std::ostream::operator<<(poVar6,rVar12);
    poVar8 = std::operator<<(poVar8,' ');
    f_01.v._M_elems[1] = in_stack_fffffffffffffe98;
    f_01.v._M_elems[0] = (double)local_50;
    f_01.v._M_elems[2] = (double)poVar6;
    beta_00.v._M_elems[1] = (double)in_stack_fffffffffffffeb0;
    beta_00.v._M_elems[0] = (double)poVar8;
    beta_00.v._M_elems[2] = (double)poVar5;
    rVar12 = ising::free_energy::
             energy<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                       (f_01,beta_00);
    poVar9 = (ostream *)std::ostream::operator<<(poVar8,rVar12);
    in_stack_fffffffffffffeb0 = std::operator<<(poVar9,' ');
    f_02.v._M_elems[1] = (double)poVar8;
    f_02.v._M_elems[0] = (double)poVar6;
    f_02.v._M_elems[2] = (double)in_stack_fffffffffffffeb0;
    beta_01.v._M_elems[1] = (double)in_stack_fffffffffffffec0;
    beta_01.v._M_elems[0] = (double)poVar5;
    beta_01.v._M_elems[2] = in_stack_fffffffffffffec8;
    in_stack_fffffffffffffe70 = local_78;
    rVar12 = ising::free_energy::
             specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                       (f_02,beta_01);
    pvVar7 = (void *)std::ostream::operator<<(in_stack_fffffffffffffeb0,rVar12);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void calc(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << (1 / t)
              << ' ' << free_energy(f, beta) << ' ' << energy(f, beta) << ' '
              << specific_heat(f, beta) << std::endl;
  }
}